

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathVec.h
# Opt level: O0

Vec3<double> * __thiscall Imath_2_5::Vec3<double>::normalize(Vec3<double> *this)

{
  Vec3<double> *in_RDI;
  double dVar1;
  double l;
  
  dVar1 = length(in_RDI);
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    in_RDI->x = in_RDI->x / dVar1;
    in_RDI->y = in_RDI->y / dVar1;
    in_RDI->z = in_RDI->z / dVar1;
  }
  return in_RDI;
}

Assistant:

const Vec3<T> &
Vec3<T>::normalize ()
{
    T l = length();

    if (l != T (0))
    {
        //
        // Do not replace the divisions by l with multiplications by 1/l.
        // Computing 1/l can overflow but the divisions below will always
        // produce results less than or equal to 1.
        //

	x /= l;
	y /= l;
	z /= l;
    }

    return *this;
}